

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

void printAllIntVectors(Vec_Ptr_t *vDisjunctions,Abc_Ntk_t *pNtk,char *fileName)

{
  int i;
  FILE *__stream;
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  char *pcVar1;
  int i_00;
  int i_01;
  size_t sStack_50;
  
  __stream = fopen(fileName,"a");
  i_01 = 0;
  do {
    if (vDisjunctions->nSize <= i_01) {
      fclose(__stream);
      return;
    }
    p = (Vec_Int_t *)Vec_PtrEntry(vDisjunctions,i_01);
    fwrite("( ",2,1,__stream);
    for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
      i = Vec_IntEntry(p,i_00);
      pObj = Abc_NtkPo(pNtk,i);
      pcVar1 = Abc_ObjName(pObj);
      pcVar1 = strstr(pcVar1,"hint");
      if (pcVar1 == (char *)0x0) {
        __assert_fail("hintSubStr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/disjunctiveMonotone.c"
                      ,0x202,"void printAllIntVectors(Vec_Ptr_t *, Abc_Ntk_t *, char *)");
      }
      fputs(pcVar1,__stream);
      if (i_00 < p->nSize + -1) {
        pcVar1 = " || ";
        sStack_50 = 4;
      }
      else {
        pcVar1 = " )\n";
        sStack_50 = 3;
      }
      fwrite(pcVar1,sStack_50,1,__stream);
    }
    i_01 = i_01 + 1;
  } while( true );
}

Assistant:

void printAllIntVectors(Vec_Ptr_t *vDisjunctions, Abc_Ntk_t *pNtk, char *fileName)
{
    Vec_Int_t *vElem;
    int i, j, iElem;
    char *name, *hintSubStr;
    FILE *fp;

    fp = fopen( fileName, "a" );

    Vec_PtrForEachEntry(Vec_Int_t *, vDisjunctions, vElem, i)
    {    
        fprintf(fp, "( ");
        Vec_IntForEachEntry( vElem, iElem, j )
        {
            name = Abc_ObjName( Abc_NtkPo(pNtk, iElem));
            hintSubStr = strstr( name, "hint");
            assert( hintSubStr );
            fprintf(fp, "%s", hintSubStr);
            if( j < Vec_IntSize(vElem) - 1 )
            {
                fprintf(fp, " || ");
            }
            else
            {
                fprintf(fp, " )\n");
            }
        }
    }
    fclose(fp);
}